

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O1

int __thiscall
OpenMD::BoxObjectiveFunction::setCoor
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  pointer pVVar2;
  double dVar3;
  uint i;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  double *pdVar7;
  Molecule *this_00;
  Mat3x3d *pMVar8;
  uint i_1;
  double (*padVar9) [3];
  double *pdVar10;
  uint j;
  long lVar11;
  Mat3x3d *pMVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  double *pdVar15;
  Mat3x3d *pMVar16;
  uint k;
  long lVar17;
  byte bVar18;
  double norm;
  undefined8 uVar19;
  MoleculeIterator miter;
  Mat3x3d Hmat;
  SquareMatrix3<double> result;
  Vector3d delta;
  Vector3d posN;
  Vector3d posO;
  Mat3x3d eps;
  RectMatrix<double,_3U,_3U> result_2;
  RectMatrix<double,_3U,_3U> result_3;
  Mat3x3d test;
  Mat3x3d y;
  SquareMatrix<double,_3> m;
  MoleculeIterator local_360;
  Mat3x3d local_358;
  double local_308 [10];
  Vector3d local_2b8;
  double local_298 [4];
  double local_278 [4];
  double local_258 [10];
  double local_208 [10];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  double local_118 [10];
  double local_c8 [6];
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar18 = 0;
  local_278[0] = 0.0;
  local_278[1] = 0.0;
  lVar5 = 0;
  local_278[2] = 0.0;
  local_298[2] = 0.0;
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_2b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_2b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_2b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_360._M_node = (_Base_ptr)0x0;
  pdVar7 = local_c8;
  local_258[8] = 0.0;
  local_258[6] = 0.0;
  local_258[7] = 0.0;
  local_258[4] = 0.0;
  local_258[5] = 0.0;
  local_258[2] = 0.0;
  local_258[3] = 0.0;
  local_258[0] = 0.0;
  local_258[1] = 0.0;
  local_118[8] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_128 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  pdVar1 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8[0] = *pdVar1;
  local_c8[4] = pdVar1[1];
  local_88 = pdVar1[2];
  local_c8[5] = pdVar1[3] * 0.5;
  dStack_90 = pdVar1[3] * 0.5;
  local_98 = pdVar1[4] * 0.5;
  local_c8[1] = pdVar1[5] * 0.5;
  local_c8[2] = pdVar1[4] * 0.5;
  local_c8[3] = pdVar1[5] * 0.5;
  dVar3 = 0.0;
  do {
    lVar11 = 0;
    do {
      dVar3 = dVar3 + pdVar7[lVar11] * pdVar7[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar5 = lVar5 + 1;
    pdVar7 = pdVar7 + 3;
  } while (lVar5 != 3);
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  iVar4 = -1;
  if (dVar3 <= 0.7) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)local_258 + lVar5 + 0x10) =
           *(undefined8 *)((long)local_c8 + lVar5 + 0x10);
      uVar19 = *(undefined8 *)((long)local_c8 + lVar5 + 8);
      *(undefined8 *)((long)local_258 + lVar5) = *(undefined8 *)((long)local_c8 + lVar5);
      *(undefined8 *)((long)local_258 + lVar5 + 8) = uVar19;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
    do {
      local_308[6] = 0.0;
      local_308[7] = 0.0;
      local_308[4] = 0.0;
      local_308[5] = 0.0;
      local_308[2] = 0.0;
      local_308[3] = 0.0;
      local_308[0] = 0.0;
      local_308[1] = 0.0;
      local_308[8] = 0.0;
      lVar5 = 0;
      pdVar7 = local_258;
      do {
        lVar11 = 0;
        pdVar10 = local_258;
        do {
          dVar3 = local_308[lVar5 * 3 + lVar11];
          lVar17 = 0;
          pdVar15 = pdVar10;
          do {
            dVar3 = dVar3 + pdVar7[lVar17] * *pdVar15;
            lVar17 = lVar17 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar17 != 3);
          local_308[lVar5 * 3 + lVar11] = dVar3;
          lVar11 = lVar11 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar11 != 3);
        lVar5 = lVar5 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar5 != 3);
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
      local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
      lVar5 = 0;
      pdVar7 = local_308;
      padVar9 = (double (*) [3])&local_358;
      do {
        lVar11 = 0;
        do {
          (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar11]
               = pdVar7[lVar11] * 0.5;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar5 = lVar5 + 1;
        padVar9 = padVar9 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar5 != 3);
      local_208[6] = 0.0;
      local_208[7] = 0.0;
      local_208[4] = 0.0;
      local_208[5] = 0.0;
      local_208[2] = 0.0;
      local_208[3] = 0.0;
      local_208[0] = 0.0;
      local_208[1] = 0.0;
      local_208[8] = 0.0;
      lVar5 = 0;
      pdVar7 = local_c8;
      padVar9 = (double (*) [3])&local_358;
      pdVar10 = local_208;
      do {
        lVar11 = 0;
        do {
          pdVar10[lVar11] = pdVar7[lVar11] - (*padVar9)[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar5 = lVar5 + 1;
        pdVar10 = pdVar10 + 3;
        padVar9 = padVar9 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar5 != 3);
      pdVar7 = local_208;
      pdVar10 = local_118;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = *pdVar7;
        pdVar7 = pdVar7 + (ulong)bVar18 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar18 * -2 + 1;
      }
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = 0;
      uStack_1a0 = 0;
      local_198 = 0;
      uStack_190 = 0;
      local_188 = 0;
      uStack_180 = 0;
      local_178 = 0;
      lVar5 = 0;
      pdVar7 = local_118;
      pdVar10 = local_258;
      puVar6 = &local_1b8;
      do {
        lVar11 = 0;
        do {
          puVar6[lVar11] = pdVar7[lVar11] - pdVar10[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar5 = lVar5 + 1;
        puVar6 = puVar6 + 3;
        pdVar10 = pdVar10 + 3;
        pdVar7 = pdVar7 + 3;
      } while (lVar5 != 3);
      puVar6 = &local_168;
      puVar13 = &local_1b8;
      puVar14 = puVar6;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar14 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
      }
      dVar3 = 0.0;
      lVar5 = 0;
      do {
        lVar11 = 0;
        do {
          dVar3 = dVar3 + (double)puVar6[lVar11] * (double)puVar6[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar5 = lVar5 + 1;
        puVar6 = puVar6 + 3;
      } while (lVar5 != 3);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      pdVar7 = local_208;
      pdVar10 = local_258;
      for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = *pdVar7;
        pdVar7 = pdVar7 + (ulong)bVar18 * -2 + 1;
        pdVar10 = pdVar10 + (ulong)bVar18 * -2 + 1;
      }
    } while (1e-10 < dVar3);
    puVar6 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_38 = 0;
    lVar5 = 0;
    do {
      lVar11 = 0;
      do {
        uVar19 = 0x3ff0000000000000;
        if (lVar5 != lVar11) {
          uVar19 = 0;
        }
        puVar6[lVar11] = uVar19;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar5 = lVar5 + 1;
      puVar6 = puVar6 + 3;
    } while (lVar5 != 3);
    pdVar7 = local_308;
    local_308[6] = 0.0;
    local_308[7] = 0.0;
    local_308[4] = 0.0;
    local_308[5] = 0.0;
    local_308[2] = 0.0;
    local_308[3] = 0.0;
    local_308[0] = 0.0;
    local_308[1] = 0.0;
    local_308[8] = 0.0;
    pdVar10 = local_258;
    puVar6 = &local_78;
    lVar5 = 0;
    do {
      lVar11 = 0;
      do {
        pdVar7[lVar11] = (double)puVar6[lVar11] + pdVar10[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar5 = lVar5 + 1;
      pdVar7 = pdVar7 + 3;
      pdVar10 = pdVar10 + 3;
      puVar6 = puVar6 + 3;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      *(undefined8 *)
       ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar5 + 0x10) = *(undefined8 *)((long)local_308 + lVar5 + 0x10);
      uVar19 = *(undefined8 *)((long)local_308 + lVar5 + 8);
      *(undefined8 *)
       ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar5) = *(undefined8 *)((long)local_308 + lVar5);
      *(undefined8 *)
       ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
       lVar5 + 8) = uVar19;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
    pMVar12 = &this->deformation_;
    lVar5 = 0;
    do {
      *(undefined8 *)
       ((long)(this->deformation_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0] + lVar5 + 0x10) =
           *(undefined8 *)
            ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar5 + 0x10);
      uVar19 = *(undefined8 *)
                ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + lVar5 + 8);
      puVar6 = (undefined8 *)
               ((long)(pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar5);
      *puVar6 = *(undefined8 *)
                 ((long)local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar5);
      puVar6[1] = uVar19;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
    this_00 = SimInfo::beginMolecule(this->info_,&local_360);
    if (this_00 != (Molecule *)0x0) {
      lVar5 = 0;
      do {
        pVVar2 = (this->refPos_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_278[2] = pVVar2[lVar5].super_Vector<double,_3U>.data_[2];
        pVVar2 = pVVar2 + lVar5;
        local_278[0] = (pVVar2->super_Vector<double,_3U>).data_[0];
        local_278[1] = (pVVar2->super_Vector<double,_3U>).data_[1];
        Molecule::getCom((Vector3d *)&local_358,this_00);
        local_298[2] = local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][2];
        local_298[0] = local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][0];
        local_298[1] = local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][1];
        local_308[0] = 0.0;
        local_308[1] = 0.0;
        local_308[2] = 0.0;
        lVar11 = 0;
        pMVar8 = pMVar12;
        do {
          dVar3 = local_308[lVar11];
          lVar17 = 0;
          do {
            dVar3 = dVar3 + (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                            .data_[0][lVar17] * local_278[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_308[lVar11] = dVar3;
          lVar11 = lVar11 + 1;
          pMVar8 = (Mat3x3d *)
                   ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                   1);
        } while (lVar11 != 3);
        local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
        local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
        local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
        lVar11 = 0;
        do {
          local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar11]
               = local_308[lVar11] - local_298[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_2b8.super_Vector<double,_3U>.data_[2] =
             local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
        local_2b8.super_Vector<double,_3U>.data_[0] =
             local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
        local_2b8.super_Vector<double,_3U>.data_[1] =
             local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
        lVar5 = lVar5 + 1;
        Molecule::moveCom(this_00,&local_2b8);
        this_00 = SimInfo::nextMolecule(this->info_,&local_360);
      } while (this_00 != (Molecule *)0x0);
    }
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    lVar5 = 0;
    do {
      lVar11 = 0;
      pMVar8 = &this->refHmat_;
      do {
        pdVar7 = local_358.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                 [lVar5] + lVar11;
        dVar3 = *pdVar7;
        lVar17 = 0;
        pMVar16 = pMVar8;
        do {
          dVar3 = dVar3 + (pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar17] *
                          (pMVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
          lVar17 = lVar17 + 1;
          pMVar16 = (Mat3x3d *)
                    ((pMVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar17 != 3);
        *pdVar7 = dVar3;
        lVar11 = lVar11 + 1;
        pMVar8 = (Mat3x3d *)
                 ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 + 1);
      } while (lVar11 != 3);
      lVar5 = lVar5 + 1;
      pMVar12 = (Mat3x3d *)
                ((pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar5 != 3);
    Snapshot::setHmat(this->info_->sman_->currentSnapshot_,&local_358);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int BoxObjectiveFunction::setCoor(const DynamicVector<RealType>& x) {
    Vector3d posO;
    Vector3d posN;
    Vector3d delta;
    SimInfo::MoleculeIterator miter;
    Molecule* mol;
    Mat3x3d eta(0.0);
    Mat3x3d eps(0.0);
    Mat3x3d y(0.0);
    Mat3x3d test(0.0);
    RealType norm;

    // η is the Lagrangian strain tensor:
    eta.setupVoigtTensor(x[0], x[1], x[2], x[3] / 2., x[4] / 2., x[5] / 2.);

    // Make sure the deformation isn't too large:
    if (eta.frobeniusNorm() > 0.7) {
      // Deformation is too large, return an error condition:
      return -1;
    }

    // Find the physical strain tensor, ε, from the Lagrangian strain, η:
    // η = ε + 0.5 * ε^2
    norm = 1.0;
    eps  = eta;
    while (norm > 1.0e-10) {
      y    = eta - eps * eps / 2.0;
      test = y - eps;
      norm = test.frobeniusNorm();
      eps  = y;
    }
    deformation_ = SquareMatrix3<RealType>::identity() + eps;

    int index = 0;

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      posO  = refPos_[index++];
      posN  = mol->getCom();
      delta = deformation_ * posO - posN;
      mol->moveCom(delta);
    }

    Mat3x3d Hmat = deformation_ * refHmat_;
    info_->getSnapshotManager()->getCurrentSnapshot()->setHmat(Hmat);
    return 0;
  }